

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O0

string * __thiscall
MinVR::VRFakeTrackerDevice::printInstructions_abi_cxx11_(VRFakeTrackerDevice *this)

{
  long in_RSI;
  string *in_RDI;
  ulong uVar1;
  char *__s;
  char tmp [50];
  string *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  char *__lhs;
  allocator<char> *in_stack_fffffffffffffbb0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffffbc8;
  undefined1 local_3e9 [33];
  string local_3c8 [32];
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [32];
  string local_360 [32];
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  char local_2b8 [55];
  allocator<char> local_281;
  string local_280 [32];
  string local_260 [32];
  string local_240 [39];
  undefined1 local_219 [33];
  string local_1f8 [32];
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [54];
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::allocator<char>::~allocator(&local_12);
  std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_128,in_RSI + 0x70);
  std::operator+((char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_190,in_RSI + 0x130);
  std::operator+((char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_170);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  uVar1 = in_RSI + 0xb0;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_1f8,uVar1);
  std::operator+((char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_219;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)(local_219 + 1));
  std::__cxx11::string::~string((string *)(local_219 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_219);
  __s = (char *)(in_RSI + 0xf0);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_260,(ulong)__s);
  std::operator+((char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_240);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_260);
  __a = &local_281;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::__cxx11::string::operator+=((string *)in_RDI,local_280);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  sprintf(local_2b8,"xyScale = %.3f, zScale = %.3f, rotation=%.3f",
          (double)*(float *)(in_RSI + 0x170),(double)*(float *)(in_RSI + 0x174),
          (double)*(float *)(in_RSI + 0x178));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::operator+((char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::operator+((char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
  std::__cxx11::string::operator+=((string *)in_RDI,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  if ((*(byte *)(in_RSI + 0x17d) & 1) == 0) {
    __lhs = "looker";
  }
  else {
    __lhs = "seeker";
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::operator+(__lhs,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_3a8);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string((string *)(local_3e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3e9);
  return in_RDI;
}

Assistant:

std::string VRFakeTrackerDevice::printInstructions() {

  std::string out = "";

  out += "Tracker " + _trackerName + " is listening to " + _eventName + " events.\n";
  out += "Use " + _toggleEvent + " to toggle this tracker off and on.\n";
  out += "Use " + _rotateOnEvent.substr(0, _rotateOnEvent.size() - 5);
  out += std::string(" to rotate around X (pitch) and Y (yaw),");
  out += " and " + _rollOnEvent.substr(0, _rollOnEvent.size() - 5);
  out += std::string(" to rotate around Z (roll).\n");
  out += "Use " + _translateOnEvent.substr(0, _translateOnEvent.size() - 5);
  out += std::string(" to translate in X and Y,");
  out += " and " + _translateZOnEvent.substr(0, _translateZOnEvent.size() - 5);
  out += std::string(" to translate in Z.\n");
  char tmp[50];
  sprintf(tmp, "xyScale = %.3f, zScale = %.3f, rotation=%.3f",
          _xyScale, _zScale, _rScale);
  out += "The scale factors are: " + std::string(tmp) + "\n";
  out += "Sticky mode is " + std::string(_sticky ? "on" : "off") + ",";
  out += " and the observation style is '" + std::string(_seeker ? "seeker" : "looker") + "'.\n";

  return out;
}